

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int udp_ep_get_port(void *arg,void *buf,size_t *szp,nni_type t)

{
  byte *local_d0;
  uint8_t *paddr;
  undefined1 local_c0 [4];
  int port;
  nng_sockaddr sa;
  udp_ep *ep;
  size_t *psStack_28;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  void *arg_local;
  
  sa.s_storage.sa_pad[0xf] = (uint64_t)arg;
  ep._4_4_ = t;
  psStack_28 = szp;
  szp_local = (size_t *)buf;
  buf_local = arg;
  nni_mtx_lock((nni_mtx *)((long)arg + 8));
  if (*(long *)sa.s_storage.sa_pad[0xf] == 0) {
    memcpy(local_c0,(void *)(sa.s_storage.sa_pad[0xf] + 0x858),0x88);
  }
  else {
    nni_plat_udp_sockname(*(nni_plat_udp **)sa.s_storage.sa_pad[0xf],(nni_sockaddr *)local_c0);
  }
  if (local_c0._0_2_ == 3) {
    local_d0 = local_c0 + 2;
  }
  else if (local_c0._0_2_ == 4) {
    local_d0 = local_c0 + 2;
  }
  else {
    local_d0 = (byte *)0x0;
  }
  nni_mtx_unlock((nni_mtx *)(sa.s_storage.sa_pad[0xf] + 8));
  if (local_d0 == (byte *)0x0) {
    arg_local._4_4_ = 0xb;
  }
  else {
    arg_local._4_4_ =
         nni_copyout_int((uint)*local_d0 * 0x100 + (uint)local_d0[1],szp_local,psStack_28,ep._4_4_);
  }
  return arg_local._4_4_;
}

Assistant:

static int
udp_ep_get_port(void *arg, void *buf, size_t *szp, nni_type t)
{
	udp_ep      *ep = arg;
	nng_sockaddr sa;
	int          port;
	uint8_t     *paddr;

	nni_mtx_lock(&ep->mtx);
	if (ep->udp != NULL) {
		(void) nni_udp_sockname(ep->udp, &sa);
	} else {
		sa = ep->self_sa;
	}
	switch (sa.s_family) {
	case NNG_AF_INET:
		paddr = (void *) &sa.s_in.sa_port;
		break;

	case NNG_AF_INET6:
		paddr = (void *) &sa.s_in6.sa_port;
		break;

	default:
		paddr = NULL;
		break;
	}
	nni_mtx_unlock(&ep->mtx);

	if (paddr == NULL) {
		return (NNG_ESTATE);
	}

	NNI_GET16(paddr, port);
	return (nni_copyout_int(port, buf, szp, t));
}